

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# unames.cpp
# Opt level: O3

UBool icu_63::enumAlgNames
                (AlgorithmicRange *range,UChar32 start,UChar32 limit,UEnumCharNamesFn *fn,
                void *context,UCharNameChoice nameChoice)

{
  byte bVar1;
  UBool UVar2;
  char cVar3;
  uint16_t uVar4;
  short sVar5;
  uint uVar6;
  ulong uVar7;
  ulong uVar8;
  uint uVar9;
  char *pcVar10;
  char *pcVar11;
  ulong uVar12;
  char *pcVar13;
  ulong uVar14;
  uint uVar15;
  ushort local_1b8;
  uint16_t indexes [8];
  char *elements [8];
  char buffer [200];
  char *elementBases [8];
  
  if ((nameChoice & ~U_EXTENDED_CHAR_NAME) != U_UNICODE_CHAR_NAME) {
    return '\x01';
  }
  if (range->type == '\x01') {
    bVar1 = range->variant;
    uVar7 = (ulong)bVar1;
    pcVar11 = (char *)((long)&range[1].start + uVar7 * 2 + 1);
    cVar3 = *(char *)((long)&range[1].start + uVar7 * 2);
    if (cVar3 == '\0') {
      pcVar10 = buffer;
      uVar14 = 0;
    }
    else {
      uVar14 = 0;
      do {
        uVar8 = uVar14;
        buffer[uVar8] = cVar3;
        cVar3 = pcVar11[uVar8];
        uVar14 = uVar8 + 1;
      } while (cVar3 != '\0');
      pcVar11 = pcVar11 + uVar14;
      pcVar10 = buffer + uVar8 + 1;
    }
    local_1b8 = (ushort)bVar1;
    uVar4 = writeFactorSuffix((uint16_t *)(range + 1),local_1b8,pcVar11,start - range->start,indexes
                              ,elementBases,elements,pcVar10,200 - (short)uVar14);
    UVar2 = (*fn)(context,start,nameChoice,buffer,(int)uVar14 + (uint)uVar4 & 0xffff);
    if (UVar2 != '\0') {
      uVar15 = local_1b8 - 1 & 0xffff;
      do {
        start = start + 1;
        if (limit <= start) {
          return '\x01';
        }
        uVar8 = (ulong)(uVar15 * 2);
        sVar5 = *(short *)((long)indexes + uVar8);
        uVar9 = local_1b8 - 2;
        uVar6 = uVar15;
        while( true ) {
          if ((ushort)(sVar5 + 1U) < *(ushort *)((long)&range[1].start + uVar8)) break;
          indexes[uVar6] = 0;
          elements[uVar6] = elementBases[uVar6];
          uVar6 = uVar9 & 0xffff;
          uVar8 = (ulong)(uVar6 * 2);
          sVar5 = *(short *)((long)indexes + uVar8);
          uVar9 = uVar9 - 1;
        }
        indexes[uVar6] = sVar5 + 1U;
        pcVar11 = elements[uVar6];
        do {
          cVar3 = *pcVar11;
          pcVar11 = pcVar11 + 1;
        } while (cVar3 != '\0');
        elements[uVar6] = pcVar11;
        pcVar11 = pcVar10;
        sVar5 = (short)uVar14;
        if (bVar1 != 0) {
          uVar12 = 0;
          uVar8 = uVar14 & 0xffffffff;
          do {
            pcVar13 = elements[uVar12];
            cVar3 = *pcVar13;
            while (cVar3 != '\0') {
              pcVar13 = pcVar13 + 1;
              *pcVar11 = cVar3;
              pcVar11 = pcVar11 + 1;
              uVar8 = (ulong)((int)uVar8 + 1);
              cVar3 = *pcVar13;
            }
            sVar5 = (short)uVar8;
            uVar12 = uVar12 + 1;
          } while (uVar12 != uVar7);
        }
        *pcVar11 = '\0';
        UVar2 = (*fn)(context,start,nameChoice,buffer,(int32_t)sVar5);
      } while (UVar2 != '\0');
    }
    return '\0';
  }
  if ((range->type == '\0') && (uVar4 = getAlgName(range,start,nameChoice,buffer,200), uVar4 != 0))
  {
    UVar2 = (*fn)(context,start,nameChoice,buffer,(int32_t)uVar4);
    if (UVar2 == '\0') {
      return '\0';
    }
    pcVar11 = (char *)((long)elements + 0x3e);
    do {
      pcVar10 = pcVar11 + 2;
      pcVar11 = pcVar11 + 1;
    } while (*pcVar10 != '\0');
    while (start = start + 1, start < limit) {
      cVar3 = *pcVar11;
      pcVar10 = pcVar11;
      if (4 < (byte)(cVar3 + 0xbfU) && 8 < (byte)(cVar3 - 0x30U)) {
        do {
          if (cVar3 == 'F') {
            *pcVar10 = '0';
          }
          else if (cVar3 == '9') {
            cVar3 = 'A';
            goto LAB_001c2889;
          }
          cVar3 = pcVar10[-1];
          pcVar10 = pcVar10 + -1;
        } while ((8 < (byte)(cVar3 - 0x30U)) && (4 < (byte)(cVar3 + 0xbfU)));
      }
      cVar3 = cVar3 + '\x01';
LAB_001c2889:
      *pcVar10 = cVar3;
      UVar2 = (*fn)(context,start,nameChoice,buffer,(int32_t)uVar4);
      if (UVar2 == '\0') {
        return '\0';
      }
    }
  }
  return '\x01';
}

Assistant:

static UBool
enumAlgNames(AlgorithmicRange *range,
             UChar32 start, UChar32 limit,
             UEnumCharNamesFn *fn, void *context,
             UCharNameChoice nameChoice) {
    char buffer[200];
    uint16_t length;

    if(nameChoice!=U_UNICODE_CHAR_NAME && nameChoice!=U_EXTENDED_CHAR_NAME) {
        return TRUE;
    }

    switch(range->type) {
    case 0: {
        char *s, *end;
        char c;

        /* get the full name of the start character */
        length=getAlgName(range, (uint32_t)start, nameChoice, buffer, sizeof(buffer));
        if(length<=0) {
            return TRUE;
        }

        /* call the enumerator function with this first character */
        if(!fn(context, start, nameChoice, buffer, length)) {
            return FALSE;
        }

        /* go to the end of the name; all these names have the same length */
        end=buffer;
        while(*end!=0) {
            ++end;
        }

        /* enumerate the rest of the names */
        while(++start<limit) {
            /* increment the hexadecimal number on a character-basis */
            s=end;
            for (;;) {
                c=*--s;
                if(('0'<=c && c<'9') || ('A'<=c && c<'F')) {
                    *s=(char)(c+1);
                    break;
                } else if(c=='9') {
                    *s='A';
                    break;
                } else if(c=='F') {
                    *s='0';
                }
            }

            if(!fn(context, start, nameChoice, buffer, length)) {
                return FALSE;
            }
        }
        break;
    }
    case 1: {
        uint16_t indexes[8];
        const char *elementBases[8], *elements[8];
        const uint16_t *factors=(const uint16_t *)(range+1);
        uint16_t count=range->variant;
        const char *s=(const char *)(factors+count);
        char *suffix, *t;
        uint16_t prefixLength, i, idx;

        char c;

        /* name = prefix factorized-elements */

        /* copy prefix */
        suffix=buffer;
        prefixLength=0;
        while((c=*s++)!=0) {
            *suffix++=c;
            ++prefixLength;
        }

        /* append the suffix of the start character */
        length=(uint16_t)(prefixLength+writeFactorSuffix(factors, count,
                                              s, (uint32_t)start-range->start,
                                              indexes, elementBases, elements,
                                              suffix, (uint16_t)(sizeof(buffer)-prefixLength)));

        /* call the enumerator function with this first character */
        if(!fn(context, start, nameChoice, buffer, length)) {
            return FALSE;
        }

        /* enumerate the rest of the names */
        while(++start<limit) {
            /* increment the indexes in lexical order bound by the factors */
            i=count;
            for (;;) {
                idx=(uint16_t)(indexes[--i]+1);
                if(idx<factors[i]) {
                    /* skip one index and its element string */
                    indexes[i]=idx;
                    s=elements[i];
                    while(*s++!=0) {
                    }
                    elements[i]=s;
                    break;
                } else {
                    /* reset this index to 0 and its element string to the first one */
                    indexes[i]=0;
                    elements[i]=elementBases[i];
                }
            }

            /* to make matters a little easier, just append all elements to the suffix */
            t=suffix;
            length=prefixLength;
            for(i=0; i<count; ++i) {
                s=elements[i];
                while((c=*s++)!=0) {
                    *t++=c;
                    ++length;
                }
            }
            /* zero-terminate */
            *t=0;

            if(!fn(context, start, nameChoice, buffer, length)) {
                return FALSE;
            }
        }
        break;
    }
    default:
        /* undefined type */
        break;
    }

    return TRUE;
}